

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void sha256_update_block(void *vctx,uint8_t *inp)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  uint auStack_78 [12];
  uint32_t W [16];
  
  uVar1 = *vctx;
  uVar2 = *(uint *)((long)vctx + 4);
  uVar3 = *(uint *)((long)vctx + 8);
  uVar4 = *(uint *)((long)vctx + 0xc);
  uVar5 = *(uint *)((long)vctx + 0x10);
  uVar6 = *(uint *)((long)vctx + 0x14);
  uVar7 = *(uint *)((long)vctx + 0x18);
  uVar8 = *(uint *)((long)vctx + 0x1c);
  uVar16 = uVar1;
  uVar12 = uVar2;
  uVar15 = uVar3;
  uVar17 = uVar4;
  uVar21 = uVar5;
  uVar20 = uVar6;
  uVar10 = uVar7;
  uVar18 = uVar8;
  for (uVar11 = 0; uVar13 = uVar10, uVar10 = uVar20, uVar20 = uVar21, uVar14 = uVar15,
      uVar15 = uVar12, uVar12 = uVar16, uVar11 != 0x40; uVar11 = uVar11 + 1) {
    if (uVar11 < 0x10) {
      uVar16 = *(uint *)inp;
      uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      auStack_78[uVar11] = uVar16;
      inp = (uint8_t *)((long)inp + 4);
    }
    else {
      uVar9 = (uint)uVar11;
      uVar16 = auStack_78[uVar9 + 0xe & 0xf];
      uVar21 = auStack_78[uVar9 + 1 & 0xf];
      uVar16 = (uVar16 >> 10 ^ (uVar16 << 0xd | uVar16 >> 0x13) ^ (uVar16 << 0xf | uVar16 >> 0x11))
               + auStack_78[uVar9 + 9 & 0xf] + auStack_78[uVar9 & 0xf] +
               (uVar21 >> 3 ^ (uVar21 << 0xe | uVar21 >> 0x12) ^ (uVar21 << 0x19 | uVar21 >> 7));
      auStack_78[uVar9 & 0xf] = uVar16;
    }
    iVar19 = uVar18 + ((uVar10 ^ uVar13) & uVar20 ^ uVar13) +
             ((uVar20 << 7 | uVar20 >> 0x19) ^
             (uVar20 << 0x15 | uVar20 >> 0xb) ^ (uVar20 << 0x1a | uVar20 >> 6)) + uVar16 + K[uVar11]
    ;
    uVar21 = uVar17 + iVar19;
    uVar16 = (uVar14 & uVar15 ^ (uVar14 ^ uVar15) & uVar12) +
             ((uVar12 << 10 | uVar12 >> 0x16) ^
             (uVar12 << 0x13 | uVar12 >> 0xd) ^ (uVar12 << 0x1e | uVar12 >> 2)) + iVar19;
    uVar17 = uVar14;
    uVar18 = uVar13;
  }
  *(uint *)vctx = uVar12 + uVar1;
  *(uint *)((long)vctx + 4) = uVar15 + uVar2;
  *(uint *)((long)vctx + 8) = uVar14 + uVar3;
  *(uint *)((long)vctx + 0xc) = uVar17 + uVar4;
  *(uint *)((long)vctx + 0x10) = uVar20 + uVar5;
  *(uint *)((long)vctx + 0x14) = uVar10 + uVar6;
  *(uint *)((long)vctx + 0x18) = uVar13 + uVar7;
  *(uint *)((long)vctx + 0x1c) = uVar18 + uVar8;
  *(int *)((long)vctx + 0x60) = *(int *)((long)vctx + 0x60) + 1;
  return;
}

Assistant:

static void sha256_update_block(void *vctx, const uint8_t *inp)
{
  cf_sha256_context *ctx = vctx;

  /* This is a 16-word window into the whole W array. */
  uint32_t W[16];

  uint32_t a = ctx->H[0],
           b = ctx->H[1],
           c = ctx->H[2],
           d = ctx->H[3],
           e = ctx->H[4],
           f = ctx->H[5],
           g = ctx->H[6],
           h = ctx->H[7],
           Wt;

  size_t t;
  for (t = 0; t < 64; t++)
  {
    /* For W[0..16] we process the input into W.
     * For W[16..64] we compute the next W value:
     *
     * W[t] = SSIG1(W[t - 2]) + W[t - 7] + SSIG0(W[t - 15]) + W[t - 16];
     *
     * But all W indices are reduced mod 16 into our window.
     */
    if (t < 16)
    {
      W[t] = Wt = read32_be(inp);
      inp += 4;
    } else {
      Wt = SSIG1(W[(t - 2) % 16]) +
           W[(t - 7) % 16] +
           SSIG0(W[(t - 15) % 16]) +
           W[(t - 16) % 16];
      W[t % 16] = Wt;
    }

    uint32_t T1 = h + BSIG1(e) + CH(e, f, g) + K[t] + Wt;
    uint32_t T2 = BSIG0(a) + MAJ(a, b, c);
    h = g;
    g = f;
    f = e;
    e = d + T1;
    d = c;
    c = b;
    b = a;
    a = T1 + T2;
  }

  ctx->H[0] += a;
  ctx->H[1] += b;
  ctx->H[2] += c;
  ctx->H[3] += d;
  ctx->H[4] += e;
  ctx->H[5] += f;
  ctx->H[6] += g;
  ctx->H[7] += h;

  ctx->blocks++;
}